

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int serialize_cert(X509 *cert,ptls_iovec_t *dst)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uchar *p;
  uint8_t *local_20;
  
  uVar1 = i2d_X509((X509 *)cert,(uchar **)0x0);
  if ((int)uVar1 < 1) {
    __assert_fail("len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/openssl.c"
                  ,0x423,"int serialize_cert(X509 *, ptls_iovec_t *)");
  }
  local_20 = (uint8_t *)malloc((ulong)uVar1);
  dst->base = local_20;
  if (local_20 == (uint8_t *)0x0) {
    iVar3 = 0x201;
  }
  else {
    uVar2 = i2d_X509((X509 *)cert,&local_20);
    dst->len = (long)(int)uVar2;
    if (uVar1 != uVar2) {
      __assert_fail("len == dst->len",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/openssl.c"
                    ,0x429,"int serialize_cert(X509 *, ptls_iovec_t *)");
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int serialize_cert(X509 *cert, ptls_iovec_t *dst)
{
    int len = i2d_X509(cert, NULL);
    assert(len > 0);

    if ((dst->base = malloc(len)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    unsigned char *p = dst->base;
    dst->len = i2d_X509(cert, &p);
    assert(len == dst->len);

    return 0;
}